

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O1

bool Trace(DVector3 *start,sector_t *sector,DVector3 *direction,double maxDist,ActorFlags *actorMask
          ,DWORD wallMask,AActor *ignore,FTraceResults *res,DWORD flags,
          _func_ETraceStatus_FTraceResults_ptr_void_ptr *callback,void *callbackdata)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  int iVar6;
  bool bVar7;
  ulong uVar8;
  subsector_t *psVar9;
  byte bVar10;
  FTraceInfo inf;
  FTraceResults tempResult;
  FTraceInfo local_668;
  FTraceResults local_100;
  
  memset(&local_100,0,0xd0);
  local_100.Distance = 3.4028234663852886e+38;
  local_100.Fraction = 3.4028234663852886e+38;
  dVar1 = start->Z;
  local_668.Start.Y = start->Y;
  local_668.Start.X = start->X;
  local_668.Start.Z = dVar1;
  if ((sector->planes[1].Flags & 0x1d0U) == 0x100) {
    uVar8 = (ulong)sector->Portals[1];
    dVar2 = sectorPortals.Array[uVar8].mPlaneZ;
    if (dVar2 < dVar1) {
      do {
        local_668.Start.X = sectorPortals.Array[uVar8].mDisplacement.X + local_668.Start.X;
        local_668.Start.Y = sectorPortals.Array[uVar8].mDisplacement.Y + local_668.Start.Y;
        psVar9 = P_PointInSubsector(local_668.Start.X,local_668.Start.Y);
        sector = psVar9->sector;
        if ((sector->planes[1].Flags & 0x1d0U) != 0x100) goto LAB_0054dd06;
        uVar8 = (ulong)sector->Portals[1];
      } while (sectorPortals.Array[uVar8].mPlaneZ <= local_668.Start.Z &&
               local_668.Start.Z != sectorPortals.Array[uVar8].mPlaneZ);
    }
    if (dVar2 < dVar1) goto LAB_0054dd06;
  }
  uVar5 = sector->planes[0].Flags;
  while (((uVar5 & 0x1d0) == 0x100 &&
         (uVar5 = sector->Portals[0], local_668.Start.Z <= sectorPortals.Array[uVar5].mPlaneZ))) {
    local_668.Start.X = sectorPortals.Array[uVar5].mDisplacement.X + local_668.Start.X;
    local_668.Start.Y = sectorPortals.Array[uVar5].mDisplacement.Y + local_668.Start.Y;
    psVar9 = P_PointInSubsector(local_668.Start.X,local_668.Start.Y);
    sector = psVar9->sector;
    uVar5 = sector->planes[0].Flags;
  }
LAB_0054dd06:
  dVar1 = local_668.Start.Z;
  local_668.ActorMask = (ActorFlags)actorMask->Value;
  local_668.ptflags = 7;
  if (local_668.ActorMask.Value == 0) {
    local_668.ptflags = 1;
  }
  dVar2 = direction->Z;
  dVar3 = direction->Y;
  dVar4 = direction->X;
  local_668.EnterDist = 0.0;
  local_668.TraceCallback = callback;
  local_668.TraceCallbackData = callbackdata;
  local_668.TraceFlags = flags;
  local_668.Results = res;
  local_668.inshootthrough = 1;
  local_668.sectorsel = 0;
  local_668.startfrac = 0.0;
  local_668.limitz = local_668.Start.Z;
  local_668.Vec.X = dVar4;
  local_668.Vec.Y = dVar3;
  local_668.Vec.Z = dVar2;
  local_668.WallMask = wallMask;
  local_668.IgnoreThis = ignore;
  local_668.CurSector = sector;
  local_668.MaxDist = maxDist;
  memset(res,0,0xd0);
  bVar10 = callback != (_func_ETraceStatus_FTraceResults_ptr_void_ptr *)0x0 & (byte)flags >> 4;
  if (bVar10 == 1) {
    local_100.HitType = TRACE_CrossingPortal;
    local_100.SrcFromTarget.Z = dVar1;
    local_100.SrcFromTarget.Y = local_668.Start.Y;
    local_100.SrcFromTarget.X = local_668.Start.X;
    local_100.HitPos.Z = dVar1;
    local_100.HitPos.Y = local_668.Start.Y;
    local_100.HitPos.X = local_668.Start.X;
    local_100.HitVector.X = dVar4;
    local_100.HitVector.Y = dVar3;
    local_100.HitVector.Z = dVar2;
    (*callback)(&local_100,callbackdata);
  }
  bVar7 = FTraceInfo::TraceTraverse(&local_668,local_668.ptflags);
  if (bVar10 != 0) {
    local_100.HitType = TRACE_CrossingPortal;
    local_100.HitPos.Z = ((local_668.Results)->HitPos).Z;
    local_100.HitPos.Y = ((local_668.Results)->HitPos).Y;
    local_100.HitPos.X = ((local_668.Results)->HitPos).X;
    local_100.HitVector.Z = local_668.Vec.Z;
    local_100.HitVector.X = local_668.Vec.X;
    local_100.HitVector.Y = local_668.Vec.Y;
    local_100.SrcFromTarget.X = local_100.HitPos.X;
    local_100.SrcFromTarget.Y = local_100.HitPos.Y;
    local_100.SrcFromTarget.Z = local_100.HitPos.Z;
    (*callback)(&local_100,local_668.TraceCallbackData);
  }
  if (bVar7) {
    if ((flags & 1) == 0) {
      return true;
    }
    if (res->HitType - TRACE_HitFloor < 2) {
      iVar6 = (res->HitTexture).texnum;
    }
    else {
      if (res->HitType != TRACE_HitWall) {
        return true;
      }
      if (res->Tier != '\x01') {
        return true;
      }
      if (res->Line->frontsector->planes[1].Texture.texnum != skyflatnum.texnum) {
        return true;
      }
      iVar6 = res->Line->backsector->planes[1].Texture.texnum;
    }
    if (iVar6 != skyflatnum.texnum) {
      return true;
    }
    res->HitType = TRACE_HitNone;
  }
  return false;
}

Assistant:

bool Trace(const DVector3 &start, sector_t *sector, const DVector3 &direction, double maxDist,
	ActorFlags actorMask, DWORD wallMask, AActor *ignore, FTraceResults &res, DWORD flags,
	ETraceStatus(*callback)(FTraceResults &res, void *), void *callbackdata)
{
	FTraceInfo inf;
	FTraceResults tempResult;

	memset(&tempResult, 0, sizeof(tempResult));
	tempResult.Fraction = tempResult.Distance = NO_VALUE;

	inf.Start = start;
	GetPortalTransition(inf.Start, sector);
	inf.ptflags = actorMask ? PT_ADDLINES|PT_ADDTHINGS|PT_COMPATIBLE : PT_ADDLINES;
	inf.Vec = direction;
	inf.ActorMask = actorMask;
	inf.WallMask = wallMask;
	inf.IgnoreThis = ignore;
	inf.CurSector = sector;
	inf.MaxDist = maxDist;
	inf.EnterDist = 0;
	inf.TraceCallback = callback;
	inf.TraceCallbackData = callbackdata;
	inf.TraceFlags = flags;
	inf.Results = &res;
	inf.inshootthrough = true;
	inf.sectorsel=0;
	inf.startfrac = 0;
	inf.limitz = inf.Start.Z;
	memset(&res, 0, sizeof(res));

	if ((flags & TRACE_ReportPortals) && callback != NULL)
	{
		tempResult.HitType = TRACE_CrossingPortal;
		tempResult.HitPos = tempResult.SrcFromTarget = inf.Start;
		tempResult.HitVector = inf.Vec;
		callback(tempResult, inf.TraceCallbackData);
	}
	bool reslt = inf.TraceTraverse(inf.ptflags);

	if ((flags & TRACE_ReportPortals) && callback != NULL)
	{
		tempResult.HitType = TRACE_CrossingPortal;
		tempResult.HitPos = tempResult.SrcFromTarget = inf.Results->HitPos;
		tempResult.HitVector = inf.Vec;
		callback(tempResult, inf.TraceCallbackData);
	}

	if (reslt)
	{ 
		return flags ? EditTraceResult(flags, res) : true;
	}
	else
	{
		return false;
	}
}